

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPUDPv4Transmitter::DeleteDestination(RTPUDPv4Transmitter *this,RTPAddress *addr)

{
  bool bVar1;
  int iVar2;
  RTPIPv4Destination dest;
  
  if (this->init == true) {
    if (this->created == true) {
      dest.rtpaddr.sin_zero[4] = '\0';
      dest.rtpaddr.sin_zero[5] = '\0';
      dest.rtpaddr.sin_zero[6] = '\0';
      dest.rtpaddr.sin_zero[7] = '\0';
      dest.rtcpaddr.sin_family = 0;
      dest.rtcpaddr.sin_port = 0;
      dest.rtcpaddr.sin_addr.s_addr = 0;
      dest.rtcpaddr.sin_zero[0] = '\0';
      dest.rtcpaddr.sin_zero[1] = '\0';
      dest.rtcpaddr.sin_zero[2] = '\0';
      dest.rtcpaddr.sin_zero[3] = '\0';
      dest.ip = 0;
      dest.rtpaddr.sin_family = 0;
      dest.rtpaddr.sin_port = 0;
      dest.rtpaddr.sin_addr.s_addr = 0;
      dest.rtpaddr.sin_zero[0] = '\0';
      dest.rtpaddr.sin_zero[1] = '\0';
      dest.rtpaddr.sin_zero[2] = '\0';
      dest.rtpaddr.sin_zero[3] = '\0';
      dest.rtcpaddr.sin_zero[4] = '\0';
      dest.rtcpaddr.sin_zero[5] = '\0';
      dest.rtcpaddr.sin_zero[6] = '\0';
      dest.rtcpaddr.sin_zero[7] = '\0';
      bVar1 = RTPIPv4Destination::AddressToDestination(addr,&dest);
      if (bVar1) {
        iVar2 = RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPUDPv4Trans_GetHashIndex_IPv4Dest,_8317>
                ::DeleteElement(&this->destinations,&dest);
      }
      else {
        iVar2 = -0x54;
      }
    }
    else {
      iVar2 = -0x59;
    }
    return iVar2;
  }
  return -0x5a;
}

Assistant:

int RTPUDPv4Transmitter::DeleteDestination(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}
	RTPIPv4Destination dest;
	if (!RTPIPv4Destination::AddressToDestination(addr, dest))
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_INVALIDADDRESSTYPE;
	}
	
	int status = destinations.DeleteElement(dest);
	
	MAINMUTEX_UNLOCK
	return status;
}